

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> *
ising::dos::square::count
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,uint_t Lx,
          uint_t Ly)

{
  pointer puVar1;
  pointer puVar2;
  long *plVar3;
  void *pvVar4;
  undefined8 *puVar5;
  range_error *this;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_t *psVar9;
  long lVar10;
  span_t span;
  graph graph;
  basis basis;
  unitcell unitcell;
  allocator_type local_f9;
  DenseStorage<long,__1,__1,__1,_0> local_f8;
  graph local_d8;
  basis local_80;
  unitcell local_68;
  
  lattice::basis::simple(&local_80,2);
  local_68.dim_ = 2;
  local_68.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.dim_ = 0;
  local_d8.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pvVar4 = calloc(1,0x10);
  if (pvVar4 == (void *)0x0) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = std::ios::widen;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_d8.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  local_d8.dim_ = (size_t)pvVar4;
  lattice::unitcell::add_site(&local_68,(coordinate_t *)&local_d8,0);
  free((void *)local_d8.dim_);
  local_d8.dim_ = 0;
  local_d8.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  puVar5 = (undefined8 *)malloc(0x10);
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = std::ios::widen;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_d8.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  *puVar5 = 1;
  puVar5[1] = 0;
  local_d8.dim_ = (size_t)puVar5;
  lattice::unitcell::add_bond(&local_68,0,0,(offset_t *)&local_d8,0);
  free((void *)local_d8.dim_);
  puVar5 = (undefined8 *)malloc(0x10);
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = std::ios::widen;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_d8.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  *puVar5 = 0;
  puVar5[1] = 1;
  local_d8.dim_ = (size_t)puVar5;
  lattice::unitcell::add_bond(&local_68,0,0,(offset_t *)&local_d8,0);
  free((void *)local_d8.dim_);
  local_f8.m_data = (long *)0x0;
  local_f8.m_rows = 0;
  local_f8.m_cols = 0;
  Eigen::DenseStorage<long,_-1,_-1,_-1,_0>::resize(&local_f8,4,2,2);
  plVar3 = local_f8.m_data;
  if (0 < local_f8.m_cols * local_f8.m_rows) {
    memset(local_f8.m_data,0,local_f8.m_cols * local_f8.m_rows * 8);
  }
  *plVar3 = Lx;
  plVar3[local_f8.m_rows + 1] = Ly;
  lattice::graph::graph(&local_d8,&local_80,&local_68,(span_t *)&local_f8,periodic);
  free(local_f8.m_data);
  uVar6 = ((long)local_d8.bonds_.
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_d8.bonds_.
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (0x3f < uVar6) {
    this = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this,"Error: system size is too large\n");
    __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  local_f8.m_data = (long *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,uVar6 + 1,(value_type_conflict2 *)&local_f8,&local_f9);
  lVar7 = ((long)local_d8.bonds_.
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_d8.bonds_.
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  puVar2 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  do {
    if (local_d8.bonds_.
        super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_d8.bonds_.
        super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar8 = 0;
    }
    else {
      lVar8 = 0;
      psVar9 = &(local_d8.bonds_.
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_start)->target;
      lVar10 = lVar7 + (ulong)(lVar7 == 0);
      do {
        lVar8 = lVar8 + (ulong)(((uint)(uVar6 >> ((byte)*psVar9 & 0x3f)) ^
                                (uint)(uVar6 >> ((byte)((bond_t *)(psVar9 + -1))->source & 0x3f))) &
                               1);
        psVar9 = psVar9 + 3;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    puVar1 = puVar2 + lVar8;
    *puVar1 = *puVar1 + 1;
    uVar6 = uVar6 + 1;
  } while (uVar6 != (long)(1 << ((char)((uint)((int)local_d8.sites_.
                                                                                                        
                                                  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (int)local_d8.sites_.
                                                                                                      
                                                  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                 -0x49 & 0x1fU)));
  if (local_d8.bonds_.
      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.bonds_.
                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.bonds_.
                          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.bonds_.
                          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_d8.coordinates_);
  std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
            (&local_d8.sites_);
  std::vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>::~vector
            (&local_68.bonds_);
  std::vector<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>::~vector
            (&local_68.sites_);
  free(local_80.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint_t> count(uint_t Lx, uint_t Ly) {
  auto basis = lattice::basis::simple(2);
  auto unitcell = lattice::unitcell(2);
  unitcell.add_site(lattice::coordinate(0, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(0, 1), 0);
  auto graph = lattice::graph(basis, unitcell, lattice::extent(Lx, Ly));
  if (graph.num_bonds() >= std::numeric_limits<uint_t>::digits)
    throw std::range_error("Error: system size is too large\n");
  
  std::vector<uint_t> dos(graph.num_bonds() + 1, 0);
  uint_t num_states = 1 << graph.num_sites();
  for (uint_t c = 0; c < num_states; ++c) {
    uint_t energy = 0;
    for (uint_t b = 0; b < graph.num_bonds(); ++b) {
      uint_t ci = (c >> graph.source(b)) & 1;
      uint_t cj = (c >> graph.target(b)) & 1;
      energy += (ci ^ cj);
    }
    ++dos[energy];
  }
  return dos;
}